

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<float>_>::Subst_Backward(TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *B)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar3;
  long lVar4;
  long lVar5;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_d8;
  long local_c8;
  Fad<float> sum;
  Fad<float> *local_a0;
  Fad<float> *local_98;
  Fad<float> pivot;
  Fad<float> local_70;
  Fad<float> local_50;
  
  lVar1 = (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar1 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_c8 = CONCAT44(extraout_var_00,iVar2);
    while (0 < local_c8) {
      lVar1 = local_c8 + -1;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&pivot,this,lVar1);
      for (lVar5 = 0; lVar5 < (B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
          lVar5 = lVar5 + 1) {
        sum.val_ = 0.0;
        sum.dx_.num_elts = 0;
        sum.dx_.ptr_to_data = (float *)0x0;
        sum.defaultVal = 0.0;
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
        lVar4 = CONCAT44(extraout_var_01,iVar2);
        while (local_c8 < lVar4) {
          lVar4 = lVar4 + -1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,this,lVar1,lVar4);
          (*(B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_70,B,lVar4,lVar5);
          local_d8.fadexpr_.left_ = &local_50;
          local_d8.fadexpr_.right_ = &local_70;
          Fad<float>::operator+=(&sum,&local_d8);
          Fad<float>::~Fad(&local_70);
          Fad<float>::~Fad(&local_50);
        }
        (*(B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(&local_70,B,lVar1,lVar5);
        local_98 = &sum;
        local_d8.fadexpr_.left_ = (Fad<float> *)&local_a0;
        local_d8.fadexpr_.right_ = &pivot;
        local_a0 = &local_70;
        Fad<float>::Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>,Fad<float>>>
                  (&local_50,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                    *)&local_d8);
        (*(B->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(B,lVar1,lVar5,&local_50);
        Fad<float>::~Fad(&local_50);
        Fad<float>::~Fad(&local_70);
        Fad<float>::~Fad(&sum);
      }
      Fad<float>::~Fad(&pivot);
      local_c8 = lVar1;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}